

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall cmExtraKateGenerator::cmExtraKateGenerator(cmExtraKateGenerator *this)

{
  cmExtraKateGenerator *this_local;
  
  memset(this,0,0x48);
  cmExternalMakefileProjectGenerator::cmExternalMakefileProjectGenerator
            (&this->super_cmExternalMakefileProjectGenerator);
  (this->super_cmExternalMakefileProjectGenerator)._vptr_cmExternalMakefileProjectGenerator =
       (_func_int **)&PTR__cmExtraKateGenerator_00bf6128;
  std::__cxx11::string::string((string *)&this->ProjectName);
  return;
}

Assistant:

cmExtraKateGenerator::cmExtraKateGenerator()
  : cmExternalMakefileProjectGenerator()
{
}